

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_create_array_iterator(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  int class_id;
  JSValue *pJVar1;
  JSValue v;
  JSValue v_00;
  
  if ((magic & 4U) == 0) {
    v = JS_ToObject(ctx,this_val);
    class_id = 0x25;
  }
  else {
    v = JS_ToStringCheckObject(ctx,this_val);
    class_id = 0x26;
  }
  if ((int)v.tag != 6) {
    v_00 = JS_NewObjectClass(ctx,class_id);
    if ((v_00.tag & 0xffffffffU) != 6) {
      pJVar1 = (JSValue *)js_malloc(ctx,0x18);
      if (pJVar1 != (JSValue *)0x0) {
        *pJVar1 = v;
        pJVar1[1].u.int32 = magic & 3;
        *(undefined4 *)((long)&pJVar1[1].u + 4) = 0;
        if ((int)v_00.tag != -1) {
          return v_00;
        }
        *(JSValue **)((long)v_00.u.ptr + 0x30) = pJVar1;
        return v_00;
      }
      JS_FreeValue(ctx,v_00);
    }
  }
  JS_FreeValue(ctx,v);
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_create_array_iterator(JSContext *ctx, JSValueConst this_val,
                                        int argc, JSValueConst *argv, int magic)
{
    JSValue enum_obj, arr;
    JSArrayIteratorData *it;
    JSIteratorKindEnum kind;
    int class_id;

    kind = magic & 3;
    if (magic & 4) {
        /* string iterator case */
        arr = JS_ToStringCheckObject(ctx, this_val);
        class_id = JS_CLASS_STRING_ITERATOR;
    } else {
        arr = JS_ToObject(ctx, this_val);
        class_id = JS_CLASS_ARRAY_ITERATOR;
    }
    if (JS_IsException(arr))
        goto fail;
    enum_obj = JS_NewObjectClass(ctx, class_id);
    if (JS_IsException(enum_obj))
        goto fail;
    it = js_malloc(ctx, sizeof(*it));
    if (!it)
        goto fail1;
    it->obj = arr;
    it->kind = kind;
    it->idx = 0;
    JS_SetOpaque(enum_obj, it);
    return enum_obj;
 fail1:
    JS_FreeValue(ctx, enum_obj);
 fail:
    JS_FreeValue(ctx, arr);
    return JS_EXCEPTION;
}